

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasExplicitObjectName(cmGeneratorTarget *this,cmSourceFile *file)

{
  const_iterator cVar1;
  cmSourceFile *local_18;
  
  local_18 = file;
  ComputeObjectMapping(this);
  cVar1 = std::
          _Rb_tree<const_cmSourceFile_*,_const_cmSourceFile_*,_std::_Identity<const_cmSourceFile_*>,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>
          ::find(&(this->ExplicitObjectName)._M_t,&local_18);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool cmGeneratorTarget::HasExplicitObjectName(cmSourceFile const* file) const
{
  const_cast<cmGeneratorTarget*>(this)->ComputeObjectMapping();
  std::set<cmSourceFile const*>::const_iterator it =
    this->ExplicitObjectName.find(file);
  return it != this->ExplicitObjectName.end();
}